

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

matrix sptk::swipe::onesm(int xSz,int ySz)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  matrix mVar10;
  
  mVar10 = makem(xSz,ySz);
  auVar3 = _DAT_0012aa40;
  auVar2 = _DAT_0012aa30;
  if (0 < mVar10.x) {
    lVar4 = (mVar10._0_8_ >> 0x20) - 1;
    auVar7._8_4_ = (int)lVar4;
    auVar7._0_8_ = lVar4;
    auVar7._12_4_ = (int)((ulong)lVar4 >> 0x20);
    uVar5 = 0;
    auVar7 = auVar7 ^ _DAT_0012aa40;
    do {
      if (0 < mVar10.y) {
        pdVar1 = mVar10.m[uVar5];
        uVar6 = 0;
        auVar8 = auVar2;
        do {
          auVar9 = auVar8 ^ auVar3;
          if ((bool)(~(auVar7._4_4_ < auVar9._4_4_ ||
                      auVar7._0_4_ < auVar9._0_4_ && auVar9._4_4_ == auVar7._4_4_) & 1)) {
            pdVar1[uVar6] = 1.0;
          }
          if (auVar9._12_4_ <= auVar7._12_4_ &&
              (auVar9._8_4_ <= auVar7._8_4_ || auVar9._12_4_ != auVar7._12_4_)) {
            pdVar1[uVar6 + 1] = 1.0;
          }
          uVar6 = uVar6 + 2;
          lVar4 = auVar8._8_8_;
          auVar8._0_8_ = auVar8._0_8_ + 2;
          auVar8._8_8_ = lVar4 + 2;
        } while ((mVar10.y + 1U & 0xfffffffe) != uVar6);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (mVar10.x & 0x7fffffff));
  }
  return mVar10;
}

Assistant:

matrix onesm(int xSz, int ySz) {
    matrix nw_matrix = makem(xSz, ySz);
    int i, j;
    for (i = 0; i < nw_matrix.x; i++)
        for (j = 0; j < nw_matrix.y; j++)
            nw_matrix.m[i][j] = 1.;
    return(nw_matrix);
}